

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O2

void Abc_DesCleanManPointer(Abc_Des_t *p,void *pMan)

{
  void *pvVar1;
  int i;
  
  if (p != (Abc_Des_t *)0x0) {
    if (p->pManFunc == pMan) {
      p->pManFunc = (void *)0x0;
    }
    for (i = 0; i < p->vModules->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p->vModules,i);
      if (*(void **)((long)pvVar1 + 0x100) == pMan) {
        *(undefined8 *)((long)pvVar1 + 0x100) = 0;
      }
    }
  }
  return;
}

Assistant:

void Abc_DesCleanManPointer( Abc_Des_t * p, void * pMan )
{
    Abc_Ntk_t * pTemp;
    int i;
    if ( p == NULL )
        return;
    if ( p->pManFunc == pMan )
        p->pManFunc = NULL;
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        if ( pTemp->pManFunc == pMan )
            pTemp->pManFunc = NULL;
}